

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_text.c
# Opt level: O0

void textfile_bang(t_qlist *x)

{
  int iVar1;
  t_atom *ptVar2;
  bool bVar3;
  t_atom *local_38;
  t_atom *ap2;
  t_atom *ap;
  t_atom *argv;
  int local_18;
  int onset2;
  int onset;
  int argc;
  t_qlist *x_local;
  
  iVar1 = binbuf_getnatom((x->x_textbuf).b_binbuf);
  local_18 = x->x_onset;
  ptVar2 = binbuf_getvec((x->x_textbuf).b_binbuf);
  ap2 = ptVar2 + local_18;
  while( true ) {
    bVar3 = false;
    if ((local_18 < iVar1) && (bVar3 = true, ap2->a_type != A_SEMI)) {
      bVar3 = ap2->a_type == A_COMMA;
    }
    if (!bVar3) break;
    local_18 = local_18 + 1;
    ap2 = ap2 + 1;
  }
  argv._4_4_ = local_18;
  local_38 = ap2;
  while( true ) {
    bVar3 = false;
    if ((argv._4_4_ < iVar1) && (bVar3 = false, local_38->a_type != A_SEMI)) {
      bVar3 = local_38->a_type != A_COMMA;
    }
    if (!bVar3) break;
    argv._4_4_ = argv._4_4_ + 1;
    local_38 = local_38 + 1;
  }
  if (local_18 < argv._4_4_) {
    x->x_onset = argv._4_4_;
    if (ap2->a_type == A_SYMBOL) {
      outlet_anything((x->x_textbuf).b_ob.te_outlet,(ap2->a_w).w_symbol,(argv._4_4_ - local_18) + -1
                      ,ap2 + 1);
    }
    else {
      outlet_list((x->x_textbuf).b_ob.te_outlet,(t_symbol *)0x0,argv._4_4_ - local_18,ap2);
    }
  }
  else {
    x->x_onset = 0x7fffffff;
    outlet_bang(x->x_bangout);
  }
  return;
}

Assistant:

static void textfile_bang(t_qlist *x)
{
    int argc = binbuf_getnatom(x->x_binbuf),
        onset = x->x_onset, onset2;
    t_atom *argv = binbuf_getvec(x->x_binbuf);
    t_atom *ap = argv + onset, *ap2;
    while (onset < argc &&
        (ap->a_type == A_SEMI || ap->a_type == A_COMMA))
            onset++, ap++;
    onset2 = onset;
    ap2 = ap;
    while (onset2 < argc &&
        (ap2->a_type != A_SEMI && ap2->a_type != A_COMMA))
            onset2++, ap2++;
    if (onset2 > onset)
    {
        x->x_onset = onset2;
        if (ap->a_type == A_SYMBOL)
            outlet_anything(x->x_ob.ob_outlet, ap->a_w.w_symbol,
                onset2-onset-1, ap+1);
        else outlet_list(x->x_ob.ob_outlet, 0, onset2-onset, ap);
    }
    else
    {
        x->x_onset = 0x7fffffff;
        outlet_bang(x->x_bangout);
    }
}